

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O0

size_t __thiscall OpenMD::DataStorage::getSize(DataStorage *this)

{
  pointer pVVar1;
  ostream *poVar2;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_RDI;
  
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) {
    pVVar1 = (pointer)std::
                      vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                      size(in_RDI);
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 2) != 0) {
    pVVar1 = (pointer)std::
                      vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                      size(in_RDI + 1);
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 4) != 0) {
    pVVar1 = (pointer)std::
                      vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                      size(in_RDI + 2);
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 8) != 0) {
    pVVar1 = (pointer)std::
                      vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                      ::size((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                              *)(in_RDI + 3));
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x10) != 0) {
    pVVar1 = (pointer)std::
                      vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                      size(in_RDI + 4);
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x20) != 0) {
    pVVar1 = (pointer)std::
                      vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                      size(in_RDI + 5);
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x40) != 0) {
    pVVar1 = (pointer)std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 6));
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x80) != 0) {
    pVVar1 = (pointer)std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 7));
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x100) != 0) {
    pVVar1 = (pointer)std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 8));
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x200) != 0) {
    pVVar1 = (pointer)std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 9));
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x400) != 0) {
    pVVar1 = (pointer)std::
                      vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                      size(in_RDI + 10);
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x800) != 0) {
    pVVar1 = (pointer)std::
                      vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                      ::size((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                              *)(in_RDI + 0xb));
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x1000) != 0) {
    pVVar1 = (pointer)std::
                      vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                      size(in_RDI + 0xc);
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x2000) != 0) {
    pVVar1 = (pointer)std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd));
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x4000) != 0) {
    pVVar1 = (pointer)std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe));
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x8000) != 0) {
    pVVar1 = (pointer)std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf));
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x10000) != 0) {
    pVVar1 = (pointer)std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10));
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if (((ulong)in_RDI[0x12].
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x20000) != 0) {
    pVVar1 = (pointer)std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x11));
    if (pVVar1 != in_RDI[0x12].
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"size does not match");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return (size_t)in_RDI[0x12].
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
}

Assistant:

std::size_t DataStorage::getSize() {
    if (storageLayout_ & dslPosition && position.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslVelocity && velocity.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslForce && force.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslAmat && aMat.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslAngularMomentum &&
        angularMomentum.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslTorque && torque.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslParticlePot && particlePot.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslDensity && density.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslFunctional && functional.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslFunctionalDerivative &&
        functionalDerivative.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslDipole && dipole.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslQuadrupole && quadrupole.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslElectricField && electricField.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslSkippedCharge && skippedCharge.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslFlucQPosition && flucQPos.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslFlucQVelocity && flucQVel.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslFlucQForce && flucQFrc.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    if (storageLayout_ & dslSitePotential && sitePotential.size() != size_) {
      // error
      cerr << "size does not match" << endl;
    }

    return size_;
  }